

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmGetPropertyCommand::HandleSourceMode(cmGetPropertyCommand *this)

{
  ulong uVar1;
  cmSourceFile *this_00;
  char *value;
  ostream *poVar2;
  string local_1f0;
  ostringstream local_1d0 [8];
  ostringstream e;
  cmSourceFile *sf;
  allocator local_39;
  string local_38;
  cmGetPropertyCommand *local_18;
  cmGetPropertyCommand *this_local;
  
  local_18 = this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    this_00 = cmMakefile::GetOrCreateSource((this->super_cmCommand).Makefile,&this->Name,false);
    if (this_00 == (cmSourceFile *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_1d0);
      poVar2 = std::operator<<((ostream *)local_1d0,
                               "given SOURCE name that could not be found or created: ");
      std::operator<<(poVar2,(string *)&this->Name);
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1d0);
    }
    else {
      value = cmSourceFile::GetPropertyForUser(this_00,&this->PropertyName);
      this_local._7_1_ = StoreResult(this,value);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"not given name for SOURCE scope.",&local_39);
    cmCommand::SetError(&this->super_cmCommand,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGetPropertyCommand::HandleSourceMode()
{
  if(this->Name.empty())
    {
    this->SetError("not given name for SOURCE scope.");
    return false;
    }

  // Get the source file.
  if(cmSourceFile* sf =
     this->Makefile->GetOrCreateSource(this->Name))
    {
    return
      this->StoreResult(sf->GetPropertyForUser(this->PropertyName));
    }
  else
    {
    std::ostringstream e;
    e << "given SOURCE name that could not be found or created: "
      << this->Name;
    this->SetError(e.str());
    return false;
    }
}